

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextResonanceWaveLogSample(LA32WaveGenerator *this)

{
  ushort uVar1;
  Bit32u BVar2;
  Tables *pTVar3;
  Bit16u local_30;
  Bit32u local_2c;
  Bit32u sineIx;
  Bit32u decayFactor;
  Bit32u logSampleValue;
  LA32WaveGenerator *this_local;
  
  if ((this->resonancePhase == POSITIVE_FALLING_RESONANCE_SINE_SEGMENT) ||
     (this->resonancePhase == NEGATIVE_RISING_RESONANCE_SINE_SEGMENT)) {
    pTVar3 = Tables::getInstance();
    uVar1 = pTVar3->logsin9[(this->resonanceSinePosition >> 9 ^ 0xffffffff) & 0x1ff];
  }
  else {
    pTVar3 = Tables::getInstance();
    uVar1 = pTVar3->logsin9[this->resonanceSinePosition >> 9 & 0x1ff];
  }
  sineIx = (Bit32u)uVar1;
  if ((int)this->phase < 3) {
    local_2c = this->resAmpDecayFactor;
  }
  else {
    local_2c = this->resAmpDecayFactor + 1;
  }
  sineIx = this->resonanceAmpSubtraction + ((this->resonanceSinePosition >> 4) * local_2c >> 8) +
           (this->amp >> 10) + sineIx * 4;
  if ((this->phase == POSITIVE_RISING_SINE_SEGMENT) ||
     (this->phase == NEGATIVE_FALLING_SINE_SEGMENT)) {
    pTVar3 = Tables::getInstance();
    sineIx = (uint)pTVar3->logsin9[this->squareWavePosition >> 9 & 0x1ff] * 4 + sineIx;
  }
  else if ((this->phase == POSITIVE_FALLING_SINE_SEGMENT) ||
          (this->phase == NEGATIVE_RISING_SINE_SEGMENT)) {
    pTVar3 = Tables::getInstance();
    sineIx = (uint)pTVar3->logsin9[(this->squareWavePosition >> 9 ^ 0xffffffff) & 0x1ff] * 8 +
             sineIx;
  }
  if (this->cutoffVal < 0x2000000) {
    sineIx = (0x2000000 - this->cutoffVal >> 9) + 0x7bff + sineIx;
  }
  else if (this->cutoffVal < 0x2400000) {
    BVar2 = this->cutoffVal;
    pTVar3 = Tables::getInstance();
    sineIx = (uint)pTVar3->logsin9[BVar2 + 0xfe000000 >> 0xd] * 4 + sineIx;
  }
  if (sineIx - 0x1000 < 0x10000) {
    local_30 = (Bit16u)(sineIx - 0x1000);
  }
  else {
    local_30 = 0xffff;
  }
  (this->resonanceLogSample).logValue = local_30;
  (this->resonanceLogSample).sign = (uint)(1 < (int)this->resonancePhase);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextResonanceWaveLogSample() {
	Bit32u logSampleValue;
	if (resonancePhase == POSITIVE_FALLING_RESONANCE_SINE_SEGMENT || resonancePhase == NEGATIVE_RISING_RESONANCE_SINE_SEGMENT) {
		logSampleValue = Tables::getInstance().logsin9[~(resonanceSinePosition >> 9) & 511];
	} else {
		logSampleValue = Tables::getInstance().logsin9[(resonanceSinePosition >> 9) & 511];
	}
	logSampleValue <<= 2;
	logSampleValue += amp >> 10;

	// From the digital captures, the decaying speed of the resonance sine is found a bit different for the positive and the negative segments
	Bit32u decayFactor = phase < NEGATIVE_FALLING_SINE_SEGMENT ? resAmpDecayFactor : resAmpDecayFactor + 1;
	// Unsure about resonanceSinePosition here. It's possible that dedicated counter & decrement are used. Although, cutoff is finely ramped, so maybe not.
	logSampleValue += resonanceAmpSubtraction + (((resonanceSinePosition >> 4) * decayFactor) >> 8);

	// To ensure the output wave has no breaks, two different windows are applied to the beginning and the ending of the resonance sine segment
	if (phase == POSITIVE_RISING_SINE_SEGMENT || phase == NEGATIVE_FALLING_SINE_SEGMENT) {
		// The window is synchronous sine here
		logSampleValue += Tables::getInstance().logsin9[(squareWavePosition >> 9) & 511] << 2;
	} else if (phase == POSITIVE_FALLING_SINE_SEGMENT || phase == NEGATIVE_RISING_SINE_SEGMENT) {
		// The window is synchronous square sine here
		logSampleValue += Tables::getInstance().logsin9[~(squareWavePosition >> 9) & 511] << 3;
	}

	if (cutoffVal < MIDDLE_CUTOFF_VALUE) {
		// For the cutoff values below the cutoff middle point, it seems the amp of the resonance wave is exponentially decayed
		logSampleValue += 31743 + ((MIDDLE_CUTOFF_VALUE - cutoffVal) >> 9);
	} else if (cutoffVal < RESONANCE_DECAY_THRESHOLD_CUTOFF_VALUE) {
		// For the cutoff values below this point, the amp of the resonance wave is sinusoidally decayed
		Bit32u sineIx = (cutoffVal - MIDDLE_CUTOFF_VALUE) >> 13;
		logSampleValue += Tables::getInstance().logsin9[sineIx] << 2;
	}

	// After all the amp decrements are added, it should be safe now to adjust the amp of the resonance wave to what we see on captures
	logSampleValue -= 1 << 12;

	resonanceLogSample.logValue = logSampleValue < 65536 ? Bit16u(logSampleValue) : 65535;
	resonanceLogSample.sign = resonancePhase < NEGATIVE_FALLING_RESONANCE_SINE_SEGMENT ? LogSample::POSITIVE : LogSample::NEGATIVE;
}